

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall server_slot::print_timings(server_slot *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  common_log *pcVar5;
  
  if (-1 < common_log_verbosity_thold) {
    dVar1 = this->t_prompt_processing;
    dVar2 = this->t_token_generation;
    iVar3 = this->n_decoded;
    iVar4 = this->n_prompt_tokens_processed;
    pcVar5 = common_log_main();
    common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,
                   "slot %12.*s: id %2d | task %d | \nprompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n       eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n      total time = %10.2f ms / %5d tokens\n"
                   ,this->t_prompt_processing,dVar1 / (double)iVar4,(1000.0 / dVar1) * (double)iVar4
                   ,this->t_token_generation,dVar2 / (double)iVar3,(1000.0 / dVar2) * (double)iVar3,
                   this->t_prompt_processing + this->t_token_generation,0xc,"print_timings",
                   (ulong)(uint)this->id,(ulong)(uint)this->id_task,
                   (ulong)(uint)this->n_prompt_tokens_processed,(ulong)(uint)this->n_decoded,
                   (ulong)(uint)(this->n_decoded + this->n_prompt_tokens_processed));
  }
  iVar3 = this->n_draft_total;
  if ((0 < iVar3) && (-1 < common_log_verbosity_thold)) {
    iVar4 = this->n_draft_accepted;
    pcVar5 = common_log_main();
    common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,
                   "slot %12.*s: id %2d | task %d | \ndraft acceptance rate = %0.5f (%5d accepted / %5d generated)\n"
                   ,(double)((float)iVar4 / (float)iVar3),0xc,"print_timings",(ulong)(uint)this->id,
                   (ulong)(uint)this->id_task,(ulong)(uint)this->n_draft_accepted,
                   (ulong)(uint)this->n_draft_total);
  }
  return;
}

Assistant:

void print_timings() const {
        const double t_prompt        =       t_prompt_processing / n_prompt_tokens_processed;
        const double n_prompt_second = 1e3 / t_prompt_processing * n_prompt_tokens_processed;

        const double t_gen        =       t_token_generation / n_decoded;
        const double n_gen_second = 1e3 / t_token_generation * n_decoded;

        SLT_INF(*this,
                "\n"
                "prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                "       eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                "      total time = %10.2f ms / %5d tokens\n",
                t_prompt_processing, n_prompt_tokens_processed, t_prompt, n_prompt_second,
                t_token_generation, n_decoded, t_gen, n_gen_second,
                t_prompt_processing + t_token_generation, n_prompt_tokens_processed + n_decoded);

        if (n_draft_total > 0) {
            const float draft_ratio = (float) n_draft_accepted / n_draft_total;
            SLT_INF(*this,
                    "\n"
                    "draft acceptance rate = %0.5f (%5d accepted / %5d generated)\n",
                    draft_ratio, n_draft_accepted, n_draft_total
            );
        }
    }